

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O1

qsizetype indexOf_helper<QLatin1String>
                    (QStringList *that,QLatin1String needle,qsizetype from,CaseSensitivity cs)

{
  ulong uVar1;
  int iVar2;
  P _a;
  qsizetype *pqVar3;
  QStringView rhs;
  
  if (from < 0) {
    from = from + (that->d).size;
    if (from < 1) {
      from = 0;
    }
  }
  uVar1 = (that->d).size;
  if ((ulong)from < uVar1) {
    pqVar3 = &(that->d).ptr[from].d.size;
    do {
      rhs.m_data = (char16_t *)pqVar3[-1];
      rhs.m_size = *pqVar3;
      iVar2 = QtPrivate::compareStrings(needle,rhs,cs);
      if (iVar2 == 0) {
        return from;
      }
      from = from + 1;
      pqVar3 = pqVar3 + 3;
    } while (uVar1 != from);
  }
  return -1;
}

Assistant:

qsizetype indexOf_helper(const QStringList &that, String needle, qsizetype from,
                         Qt::CaseSensitivity cs)
{
    if (from < 0) // Historical behavior
        from = qMax(from + that.size(), 0);

    if (from >= that.size())
        return -1;

    for (qsizetype i = from; i < that.size(); ++i) {
        if (needle.compare(that.at(i), cs) == 0)
            return i;
    }
    return -1;
}